

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

unsigned_long
_computeNumberOperation<unsigned_long,unsigned_long>(TokenType type,unsigned_long x,unsigned_long y)

{
  allocator<char> local_49;
  string local_48;
  unsigned_long local_28;
  unsigned_long y_local;
  unsigned_long x_local;
  ulong uStack_10;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    uStack_10 = x + y;
    break;
  case TOK_OP_SUB:
    uStack_10 = x - y;
    break;
  default:
    local_28 = y;
    y_local = x;
    x_local._6_2_ = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unknown operation",&local_49);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x8b,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    uStack_10 = 0;
    break;
  case TOK_OP_MUL:
    uStack_10 = x * y;
    break;
  case TOK_OP_DIV:
    uStack_10 = x / y;
  }
  return uStack_10;
}

Assistant:

static R _computeNumberOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}